

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

void __thiscall
QItemDelegate::drawBackground
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  ColorRole CVar1;
  undefined4 uVar2;
  QAbstractItemModel *pQVar3;
  undefined4 uVar4;
  char cVar5;
  bool bVar6;
  ColorRole CVar7;
  ColorRole CVar8;
  anon_union_24_3_e3d07ef4_for_data *paVar9;
  QMetaType QVar10;
  long in_FS_OFFSET;
  QMetaType local_60;
  double local_58;
  QMetaType local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((option->showDecorationSelected == true) &&
     (CVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i, (short)CVar1 < 0)) {
    CVar7 = Light;
    if ((CVar1 >> 0x10 & 1) != 0) {
      CVar7 = CVar1 & Button ^ Button;
    }
    CVar8 = Button;
    if ((CVar1 & Button) != WindowText) {
      CVar8 = CVar7;
    }
    QPalette::brush((int)option + 0x28,CVar8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      return;
    }
  }
  else {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = (index->m).ptr;
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = (undefined1 *)0x0;
      local_48._16_8_ = (undefined1 *)0x0;
      puStack_30 = (undefined1 *)0x2;
      QVar10.d_ptr = (QMetaTypeInterface *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x90))(&local_48,pQVar3,index,8);
      QVar10.d_ptr = (QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc);
    }
    cVar5 = QMetaType::canConvert(QVar10,(QMetaType)0x7ebf88);
    if (cVar5 != '\0') {
      QPainter::brushOrigin();
      uVar2 = (option->super_QStyleOption).rect.x1;
      uVar4 = (option->super_QStyleOption).rect.y1;
      local_60.d_ptr = (QMetaTypeInterface *)(double)(int)uVar2;
      local_58 = (double)(int)uVar4;
      QPainter::setBrushOrigin((QPointF *)painter);
      local_60.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
      local_50.d_ptr = (QMetaTypeInterface *)((ulong)puStack_30 & 0xfffffffffffffffc);
      bVar6 = comparesEqual(&local_50,&local_60);
      if (bVar6) {
        if (((ulong)puStack_30 & 1) == 0) {
          paVar9 = &local_48;
        }
        else {
          paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QBrush::QBrush((QBrush *)&local_50,(QBrush *)paVar9->data);
      }
      else {
        local_50.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        QBrush::QBrush((QBrush *)&local_50);
        paVar9 = &local_48;
        QVar10.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_30 & 1) != 0) {
          paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_48.shared + *(int *)(local_48.shared + 4));
        }
        QMetaType::convert(QVar10,paVar9,local_60,&local_50);
      }
      QPainter::fillRect((QRect *)painter,(QBrush *)&(option->super_QStyleOption).rect);
      QBrush::~QBrush((QBrush *)&local_50);
      QPainter::setBrushOrigin((QPointF *)painter);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::drawBackground(QPainter *painter,
                                   const QStyleOptionViewItem &option,
                                   const QModelIndex &index) const
{
    if (option.showDecorationSelected && (option.state & QStyle::State_Selected)) {
        QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                                  ? QPalette::Normal : QPalette::Disabled;
        if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
            cg = QPalette::Inactive;

        painter->fillRect(option.rect, option.palette.brush(cg, QPalette::Highlight));
    } else {
        QVariant value = index.data(Qt::BackgroundRole);
        if (value.canConvert<QBrush>()) {
            QPointF oldBO = painter->brushOrigin();
            painter->setBrushOrigin(option.rect.topLeft());
            painter->fillRect(option.rect, qvariant_cast<QBrush>(value));
            painter->setBrushOrigin(oldBO);
        }
    }
}